

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barcode.h
# Opt level: O0

void __thiscall
barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
::new_barcode(barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
              *this,value_t birth,value_t death)

{
  ostream *poVar1;
  long in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  
  poVar1 = std::operator<<((ostream *)(in_RDI + 8)," [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_XMM0_Da);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_XMM1_Da);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

inline void new_barcode(value_t birth, value_t death) {
		file_output_t<Complex>::outstream << " [" << birth << ", " << death << ")" << std::endl;
	}